

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotor.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsMotor::IntLoadResidual_F(ChShaftsMotor *this,uint off,ChVectorDynamic<> *R,double c)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ChShaft *pCVar4;
  int iVar5;
  Scalar *pSVar6;
  undefined4 in_register_00000034;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  if (this->motor_mode == MOT_MODE_TORQUE) {
    pCVar4 = (this->super_ChShaftsMotorBase).super_ChShaftsCouple.shaft1;
    iVar5 = (*(pCVar4->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])
                      (pCVar4,CONCAT44(in_register_00000034,off));
    if ((char)iVar5 != '\0') {
      dVar1 = this->motor_torque;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                          (ulong)(((this->super_ChShaftsMotorBase).super_ChShaftsCouple.shaft1)->
                                 super_ChPhysicsItem).offset_w);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = c;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = dVar1;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *pSVar6;
      auVar2 = vfmadd213sd_fma(auVar9,auVar7,auVar2);
      *pSVar6 = auVar2._0_8_;
    }
    iVar5 = (*(((this->super_ChShaftsMotorBase).super_ChShaftsCouple.shaft2)->super_ChPhysicsItem).
              super_ChObj._vptr_ChObj[9])();
    if ((char)iVar5 != '\0') {
      dVar1 = this->motor_torque;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                          (ulong)(((this->super_ChShaftsMotorBase).super_ChShaftsCouple.shaft2)->
                                 super_ChPhysicsItem).offset_w);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = c;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = dVar1;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *pSVar6;
      auVar2 = vfnmadd213sd_fma(auVar8,auVar10,auVar3);
      *pSVar6 = auVar2._0_8_;
    }
  }
  return;
}

Assistant:

void ChShaftsMotor::IntLoadResidual_F(const unsigned int off,  // offset in R residual
                                      ChVectorDynamic<>& R,    // result: the R residual, R += c*F
                                      const double c           // a scaling factor
                                      ) {
    if (motor_mode == MOT_MODE_TORQUE) {
        if (shaft1->IsActive())
            R(shaft1->GetOffset_w()) += motor_torque * c;
        if (shaft2->IsActive())
            R(shaft2->GetOffset_w()) += -motor_torque * c;
    }
}